

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::~SourceCodeInfo_Location(SourceCodeInfo_Location *this)

{
  ~SourceCodeInfo_Location(this);
  operator_delete(this);
  return;
}

Assistant:

SourceCodeInfo_Location::~SourceCodeInfo_Location() {
  // @@protoc_insertion_point(destructor:google.protobuf.SourceCodeInfo.Location)
  SharedDtor();
}